

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::_::HashSetCallbacks>::
find<kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char_const>&>
          (HashIndex<kj::_::HashSetCallbacks> *this,
          ArrayPtr<kj::ArrayPtr<const_unsigned_char>_> table,ArrayPtr<const_unsigned_char> *params)

{
  uchar *puVar1;
  ulong uVar2;
  uchar *__s2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  uint *puVar6;
  long lVar7;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 __n;
  ArrayPtr<const_unsigned_char> *pAVar8;
  ArrayPtr<const_unsigned_char> *in_R8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  Maybe<unsigned_long> MVar12;
  Maybe<unsigned_long> MVar13;
  
  MVar12.ptr.field_1.value = table.size_;
  pAVar8 = table.ptr;
  if (pAVar8[1].size_ == 0) {
    *(undefined1 *)this = 0;
    MVar12.ptr._0_8_ = this;
    return (Maybe<unsigned_long>)MVar12.ptr;
  }
  uVar4 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,*in_R8);
  puVar1 = pAVar8[1].ptr;
  uVar2 = pAVar8[1].size_;
  uVar11 = (ulong)((int)uVar2 - 1U & uVar4);
  uVar9 = *(uint *)(puVar1 + uVar11 * 8 + 4);
  __n = extraout_RDX;
  if (uVar9 != 0) {
    puVar6 = (uint *)(puVar1 + uVar11 * 8);
    __s2 = in_R8->ptr;
    sVar3 = in_R8->size_;
    do {
      if ((uVar9 != 1) && (*puVar6 == uVar4)) {
        lVar7 = (ulong)(uVar9 - 2) * 0x10;
        __n = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
              ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
              (MVar12.ptr.field_1.value + 8 + lVar7))->value;
        if (__n.value == sVar3) {
          if (__n.value != 0) {
            iVar5 = bcmp(*(void **)(lVar7 + MVar12.ptr.field_1.value),__s2,__n.value);
            __n = extraout_RDX_00;
            if (iVar5 != 0) goto LAB_0018b176;
          }
          *(undefined1 *)this = 1;
          this->erasedCount = (ulong)(uVar9 - 2);
          goto LAB_0018b1af;
        }
      }
LAB_0018b176:
      uVar10 = uVar11 + 1;
      uVar11 = uVar10 & 0xffffffff;
      if (uVar10 == uVar2) {
        uVar11 = 0;
      }
      puVar6 = (uint *)(puVar1 + uVar11 * 8);
      uVar9 = puVar6[1];
    } while (uVar9 != 0);
  }
  *(undefined1 *)this = 0;
LAB_0018b1af:
  MVar13.ptr.field_1.value = __n.value;
  MVar13.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar13.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }